

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.hpp
# Opt level: O1

void __thiscall
cvs_rk::matrix<cvs_rk::rk_function<9223372036854775783UL>_>::matrix
          (matrix<cvs_rk::rk_function<9223372036854775783UL>_> *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *rows)

{
  pointer pbVar1;
  size_type __n;
  pointer pcVar2;
  vector<std::vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>,_std::allocator<std::vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>_>_>
  *pvVar3;
  matrix<cvs_rk::rk_function<9223372036854775783UL>_> *this_00;
  pointer pbVar4;
  pointer pvVar5;
  size_type sVar6;
  iterator __begin2;
  ulong uVar7;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  undefined1 auVar8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> r;
  allocator_type local_9a;
  allocator_type local_99;
  vector<std::vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>,_std::allocator<std::vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>_>_>
  *local_98;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_90;
  undefined1 local_88 [32];
  matrix<cvs_rk::rk_function<9223372036854775783UL>_> *local_68;
  vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
  local_60;
  vector<std::vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>,_std::allocator<std::vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>_>_>
  local_48;
  
  (this->H).sigma.val = 0x100;
  local_90 = &this->rows;
  local_98 = &this->columns;
  auVar8 = ZEXT1632(ZEXT816(0) << 0x40);
  this->rows = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )auVar8._0_24_;
  (this->columns).
  super__Vector_base<std::vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>,_std::allocator<std::vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)auVar8._24_8_;
  *(undefined1 (*) [32])
   &(this->rows).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = auVar8;
  pbVar4 = (rows->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (rows->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  __n = pbVar4->_M_string_length;
  local_68 = this;
  if (pbVar4 != pbVar1) {
    do {
      pcVar2 = (pbVar4->_M_dataplus)._M_p;
      local_88._0_8_ = (pointer)(local_88 + 0x10);
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_88,pcVar2,pcVar2 + pbVar4->_M_string_length);
      if ((pointer)local_88._0_8_ != (pointer)(local_88 + 0x10)) {
        operator_delete((void *)local_88._0_8_);
      }
      pbVar4 = pbVar4 + 1;
    } while (pbVar4 != pbVar1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(local_90,rows);
  std::
  vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
  ::vector(&local_60,
           (long)(rows->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish -
           (long)(rows->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start >> 5,&local_99);
  std::
  vector<std::vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>,_std::allocator<std::vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>_>_>
  ::vector(&local_48,__n,&local_60,&local_9a);
  this_00 = local_68;
  local_88._0_8_ =
       (local_68->columns).
       super__Vector_base<std::vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>,_std::allocator<std::vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_88._8_8_ =
       (local_68->columns).
       super__Vector_base<std::vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>,_std::allocator<std::vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_88._16_8_ =
       (local_68->columns).
       super__Vector_base<std::vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>,_std::allocator<std::vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (local_68->columns).
  super__Vector_base<std::vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>,_std::allocator<std::vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_48.
       super__Vector_base<std::vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>,_std::allocator<std::vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (local_68->columns).
  super__Vector_base<std::vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>,_std::allocator<std::vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_48.
       super__Vector_base<std::vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>,_std::allocator<std::vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (local_68->columns).
  super__Vector_base<std::vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>,_std::allocator<std::vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_48.
       super__Vector_base<std::vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>,_std::allocator<std::vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_48.
  super__Vector_base<std::vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>,_std::allocator<std::vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.
  super__Vector_base<std::vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>,_std::allocator<std::vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.
  super__Vector_base<std::vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>,_std::allocator<std::vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>,_std::allocator<std::vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>_>_>
  ::~vector((vector<std::vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>,_std::allocator<std::vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>_>_>
             *)local_88);
  std::
  vector<std::vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>,_std::allocator<std::vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>_>_>
  ::~vector(&local_48);
  pvVar3 = local_98;
  if (local_60.
      super__Vector_base<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_60.
                    super__Vector_base<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  pbVar4 = (rows->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((rows->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish != pbVar4) {
    uVar7 = 0;
    do {
      rk_function<9223372036854775783UL>::to_mod_vector
                ((vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
                  *)local_88,&this_00->H,pbVar4 + uVar7);
      if (__n != 0) {
        pvVar5 = (pvVar3->
                 super__Vector_base<std::vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>,_std::allocator<std::vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        sVar6 = 0;
        do {
          *(pointer *)
           (*(long *)&(pvVar5->
                      super__Vector_base<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
                      )._M_impl.super__Vector_impl_data + uVar7 * 8) =
               (&(((_Vector_base<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
                    *)local_88._0_8_)->_M_impl).super__Vector_impl_data._M_start)[sVar6];
          sVar6 = sVar6 + 1;
          pvVar5 = pvVar5 + 1;
        } while (__n != sVar6);
      }
      if ((pointer)local_88._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_88._0_8_);
      }
      uVar7 = uVar7 + 1;
      pbVar4 = (rows->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
    } while (uVar7 < (ulong)((long)(rows->
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar4 >> 5))
    ;
  }
  return;
}

Assistant:

matrix(vector<string>& rows){

		assert(rows.size()>0);
		ulint c = rows[0].size();

		//all rows must have the same length
		for(auto r:rows){
			assert(r.size() == c);
		}

		this->rows = rows;

		columns = { c, vector<mod_int_t>(rows.size()) };

		//for each row, compute associated
		//weighted modular vector and transfer it
		//into columns
		for(ulint i=0;i<rows.size();++i){

			vector<mod_int_t> r_mod = H.to_mod_vector(rows[i]);

			for(ulint j = 0;j<c;++j){

				columns[j][i] = r_mod[j];

			}

		}

	}